

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_store_send(t_list_store *x,t_symbol *s)

{
  t_pd *pp_Var1;
  t_atom *to;
  int iVar2;
  t_symbol *ptVar3;
  t_atom *ptVar4;
  long lVar5;
  t_atom tStack_68;
  t_pd *local_58;
  t_pd *local_50;
  t_atom *local_48;
  undefined1 local_40 [8];
  t_alist y;
  int n;
  t_atom *vec;
  t_symbol *s_local;
  t_list_store *x_local;
  
  ptVar4 = &tStack_68;
  y.l_vec._4_4_ = (x->x_alist).l_n;
  if (s->s_thing == (_class **)0x0) {
    pd_error(x,"%s: no such object",s->s_name);
  }
  else {
    if (y.l_vec._4_4_ < 100) {
      ptVar4 = &tStack_68 + -(long)y.l_vec._4_4_;
      local_48 = ptVar4;
    }
    else {
      local_48 = (t_atom *)getbytes((long)y.l_vec._4_4_ << 4);
    }
    iVar2 = y.l_vec._4_4_;
    to = local_48;
    if ((x->x_alist).l_npointer == 0) {
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4e97;
      alist_toatoms(&x->x_alist,to,0,iVar2);
      local_58 = s->s_thing;
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4eaf;
      ptVar3 = gensym("list");
      iVar2 = y.l_vec._4_4_;
      pp_Var1 = local_58;
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4ec2;
      pd_list(pp_Var1,ptVar3,iVar2,to);
    }
    else {
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4e39;
      alist_clone(&x->x_alist,(t_alist *)local_40,0,iVar2);
      iVar2 = y.l_vec._4_4_;
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4e4b;
      alist_toatoms((t_alist *)local_40,to,0,iVar2);
      local_50 = s->s_thing;
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4e63;
      ptVar3 = gensym("list");
      iVar2 = y.l_vec._4_4_;
      pp_Var1 = local_50;
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4e76;
      pd_list(pp_Var1,ptVar3,iVar2,to);
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4e7f;
      alist_clear((t_alist *)local_40);
    }
    tStack_68.a_w._7_1_ = 1;
    if (99 < y.l_vec._4_4_) {
      lVar5 = (long)y.l_vec._4_4_;
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1c4ede;
      freebytes(to,lVar5 << 4);
    }
  }
  return;
}

Assistant:

static void list_store_send(t_list_store *x, t_symbol *s)
{
    t_atom *vec;
    int n = x->x_alist.l_n;
    if (!s->s_thing)
    {
        pd_error(x, "%s: no such object", s->s_name);
        return;
    }
    ATOMS_ALLOCA(vec, n);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, 0, n);
        alist_toatoms(&y, vec, 0, n);
        pd_list(s->s_thing, gensym("list"), n, vec);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, vec, 0, n);
        pd_list(s->s_thing, gensym("list"), n, vec);
    }
    ATOMS_FREEA(vec, n);
}